

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_Expiry_Test::TestBody(X509Test_Expiry_Test *this)

{
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  initializer_list<x509_st_*> __l_09;
  initializer_list<x509_st_*> __l_10;
  initializer_list<x509_st_*> __l_11;
  initializer_list<x509_st_*> __l_12;
  initializer_list<x509_st_*> __l_13;
  initializer_list<x509_st_*> __l_14;
  initializer_list<x509_st_*> __l_15;
  initializer_list<x509_st_*> __l_16;
  initializer_list<x509_st_*> __l_17;
  initializer_list<x509_st_*> __l_18;
  initializer_list<x509_st_*> __l_19;
  initializer_list<x509_st_*> __l_20;
  initializer_list<x509_st_*> __l_21;
  initializer_list<x509_st_*> __l_22;
  initializer_list<x509_st_*> __l_23;
  initializer_list<x509_st_*> __l_24;
  initializer_list<x509_st_*> __l_25;
  bool bVar1;
  char *pcVar2;
  pointer pxVar3;
  char *in_R9;
  AssertHelper local_e70;
  Message local_e68;
  anon_class_1_0_00000001 local_e59;
  function<void_(x509_store_ctx_st_*)> local_e58;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_e38;
  allocator<x509_st_*> local_e19;
  pointer local_e18;
  iterator local_e10;
  size_type local_e08;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_e00;
  allocator<x509_st_*> local_de1;
  pointer local_de0;
  iterator local_dd8;
  size_type local_dd0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_dc8;
  int local_db0 [2];
  undefined1 local_da8 [8];
  AssertionResult gtest_ar_14;
  Message local_d90;
  function<void_(x509_store_ctx_st_*)> local_d88;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_d68;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_d48;
  allocator<x509_st_*> local_d21;
  pointer local_d20;
  iterator local_d18;
  size_type local_d10;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_d08;
  int local_cec;
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar_13;
  Message local_cd0;
  function<void_(x509_store_ctx_st_*)> local_cc8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_ca8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_c88;
  allocator<x509_st_*> local_c61;
  pointer local_c60;
  iterator local_c58;
  size_type local_c50;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_c48;
  int local_c2c;
  undefined1 local_c28 [8];
  AssertionResult gtest_ar_12;
  Message local_c10;
  function<void_(x509_store_ctx_st_*)> local_c08;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_be8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_bc8;
  allocator<x509_st_*> local_ba1;
  pointer local_ba0;
  iterator local_b98;
  size_type local_b90;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_b88;
  int local_b70 [2];
  undefined1 local_b68 [8];
  AssertionResult gtest_ar_11;
  Message local_b50;
  function<void_(x509_store_ctx_st_*)> local_b48;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_b28;
  allocator<x509_st_*> local_b09;
  pointer local_b08;
  iterator local_b00;
  size_type local_af8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_af0;
  allocator<x509_st_*> local_ad1;
  pointer local_ad0;
  iterator local_ac8;
  size_type local_ac0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_ab8;
  int local_a9c;
  undefined1 local_a98 [8];
  AssertionResult gtest_ar_10;
  Message local_a80;
  function<void_(x509_store_ctx_st_*)> local_a78;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_a58;
  allocator<x509_st_*> local_a39;
  pointer local_a38;
  iterator local_a30;
  size_type local_a28;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_a20;
  allocator<x509_st_*> local_a01;
  pointer local_a00;
  iterator local_9f8;
  size_type local_9f0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_9e8;
  int local_9cc;
  undefined1 local_9c8 [8];
  AssertionResult gtest_ar_9;
  Message local_9b0;
  function<void_(x509_store_ctx_st_*)> local_9a8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_988;
  allocator<x509_st_*> local_969;
  pointer local_968;
  iterator local_960;
  size_type local_958;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_950;
  allocator<x509_st_*> local_931;
  pointer local_930;
  iterator local_928;
  size_type local_920;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_918;
  int local_900 [2];
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar_8;
  Message local_8e0;
  function<void_(x509_store_ctx_st_*)> local_8d8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_8b8;
  allocator<x509_st_*> local_899;
  pointer local_898;
  iterator local_890;
  size_type local_888;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_880;
  allocator<x509_st_*> local_861;
  pointer local_860;
  iterator local_858;
  size_type local_850;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_848;
  int local_830 [2];
  undefined1 local_828 [8];
  AssertionResult gtest_ar_7;
  Message local_810;
  function<void_(x509_store_ctx_st_*)> local_808;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_7e8;
  allocator<x509_st_*> local_7c9;
  pointer local_7c8;
  iterator local_7c0;
  size_type local_7b8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_7b0;
  allocator<x509_st_*> local_791;
  pointer local_790;
  iterator local_788;
  size_type local_780;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_778;
  int local_75c;
  undefined1 local_758 [8];
  AssertionResult gtest_ar_6;
  Message local_740;
  function<void_(x509_store_ctx_st_*)> local_738;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_718;
  allocator<x509_st_*> local_6f9;
  pointer local_6f8;
  iterator local_6f0;
  size_type local_6e8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_6e0;
  allocator<x509_st_*> local_6c1;
  pointer local_6c0;
  iterator local_6b8;
  size_type local_6b0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_6a8;
  int local_68c;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_5;
  Message local_670;
  function<void_(x509_store_ctx_st_*)> local_668;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_648;
  allocator<x509_st_*> local_629;
  pointer local_628;
  iterator local_620;
  size_type local_618;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_610;
  allocator<x509_st_*> local_5f1;
  pointer local_5f0;
  iterator local_5e8;
  size_type local_5e0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_5d8;
  int local_5bc;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_4;
  Message local_5a0;
  function<void_(x509_store_ctx_st_*)> local_598;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_578;
  allocator<x509_st_*> local_559;
  pointer local_558;
  iterator local_550;
  size_type local_548;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_540;
  allocator<x509_st_*> local_521;
  pointer local_520;
  iterator local_518;
  size_type local_510;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_508;
  int local_4f0 [2];
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_3;
  Message local_4d0;
  function<void_(x509_store_ctx_st_*)> local_4c8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_4a8;
  allocator<x509_st_*> local_489;
  pointer local_488;
  iterator local_480;
  size_type local_478;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_470;
  allocator<x509_st_*> local_451;
  pointer local_450;
  iterator local_448;
  size_type local_440;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_438;
  int local_41c;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_2;
  Message local_400;
  function<void_(x509_store_ctx_st_*)> local_3f8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_3d8;
  allocator<x509_st_*> local_3b9;
  pointer local_3b8;
  iterator local_3b0;
  size_type local_3a8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_3a0;
  allocator<x509_st_*> local_381;
  pointer local_380;
  iterator local_378;
  size_type local_370;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_368;
  int local_34c;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_1;
  Message local_330;
  function<void_(x509_store_ctx_st_*)> local_328;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_308;
  allocator<x509_st_*> local_2e1;
  pointer local_2e0;
  iterator local_2d8;
  size_type local_2d0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_2c8;
  allocator<x509_st_*> local_2a9;
  pointer local_2a8;
  iterator local_2a0;
  size_type local_298;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_290;
  int local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar;
  int has_expired;
  int not_yet_valid;
  unsigned_long flags;
  ScopedTrace gtest_trace_4399;
  const_iterator pbStack_248;
  bool partial_chain;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_230;
  initializer_list<bool> *local_220;
  initializer_list<bool> *__range2;
  ScopedTrace gtest_trace_4397;
  const_iterator pbStack_210;
  bool check_time;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<bool> local_1f8;
  initializer_list<bool> *local_1e8;
  initializer_list<bool> *__range1;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__4;
  Certs leaf;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__3;
  Certs intermediate;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__2;
  Certs root_cross;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  Certs root;
  anon_class_8_1_610b4875 make_certs;
  anon_class_8_1_ba1d59bf make_cert;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> key;
  X509Test_Expiry_Test *this_local;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar_.message_,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8f28b1,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x10fb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    make_certs.make_cert = (anon_class_8_1_ba1d59bf *)&gtest_ar_.message_;
    root.expired._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)&make_certs;
    TestBody::anon_class_8_1_610b4875::operator()
              ((Certs *)&gtest_ar__1.message_,(anon_class_8_1_610b4875 *)&root.expired,"Root","Root"
               ,true);
    testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_a8,&root.not_yet_valid,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&root_cross.expired,(internal *)local_a8,(AssertionResult *)"root.valid",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1124,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      std::__cxx11::string::~string((string *)&root_cross.expired);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (bVar1) {
      TestBody::anon_class_8_1_610b4875::operator()
                ((Certs *)&gtest_ar__2.message_,(anon_class_8_1_610b4875 *)&root.expired,"Root 2",
                 "Root",true);
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_100,&root_cross.not_yet_valid,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar1) {
        testing::Message::Message(&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&intermediate.expired,(internal *)local_100,
                   (AssertionResult *)"root_cross.valid","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x1126,pcVar2);
        testing::internal::AssertHelper::operator=(&local_110,&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        std::__cxx11::string::~string((string *)&intermediate.expired);
        testing::Message::~Message(&local_108);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      if (bVar1) {
        TestBody::anon_class_8_1_610b4875::operator()
                  ((Certs *)&gtest_ar__3.message_,(anon_class_8_1_610b4875 *)&root.expired,"Root",
                   "Intermediate",true);
        testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_158,&intermediate.not_yet_valid,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
        if (!bVar1) {
          testing::Message::Message(&local_160);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&leaf.expired,(internal *)local_158,
                     (AssertionResult *)"intermediate.valid","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1128,pcVar2);
          testing::internal::AssertHelper::operator=(&local_168,&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          std::__cxx11::string::~string((string *)&leaf.expired);
          testing::Message::~Message(&local_160);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
        if (bVar1) {
          TestBody::anon_class_8_1_610b4875::operator()
                    ((Certs *)&gtest_ar__4.message_,(anon_class_8_1_610b4875 *)&root.expired,
                     "Intermediate","Leaf",false);
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_1b0,&leaf.not_yet_valid,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
          if (!bVar1) {
            testing::Message::Message(&local_1b8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&__range1,(internal *)local_1b0,(AssertionResult *)"leaf.valid",
                       "false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x112a,pcVar2);
            testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
            testing::internal::AssertHelper::~AssertHelper(&local_1c0);
            std::__cxx11::string::~string((string *)&__range1);
            testing::Message::~Message(&local_1b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
          if (bVar1) {
            __begin1._6_1_ = 1;
            __begin1._7_1_ = 0;
            local_1f8._M_array = (iterator)((long)&__begin1 + 6);
            local_1f8._M_len = 2;
            local_1e8 = &local_1f8;
            __end1 = std::initializer_list<bool>::begin(local_1e8);
            pbStack_210 = std::initializer_list<bool>::end(local_1e8);
            for (; __end1 != pbStack_210; __end1 = __end1 + 1) {
              __range2._7_1_ = *__end1 & 1;
              testing::ScopedTrace::ScopedTrace<bool>
                        ((ScopedTrace *)((long)&__range2 + 6),
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x112d,(bool *)((long)&__range2 + 7));
              __begin2._6_1_ = 1;
              __begin2._7_1_ = 0;
              local_230._M_array = (iterator)((long)&__begin2 + 6);
              local_230._M_len = 2;
              local_220 = &local_230;
              __end2 = std::initializer_list<bool>::begin(local_220);
              pbStack_248 = std::initializer_list<bool>::end(local_220);
              for (; __end2 != pbStack_248; __end2 = __end2 + 1) {
                flags._7_1_ = *__end2 & 1;
                testing::ScopedTrace::ScopedTrace<bool>
                          ((ScopedTrace *)((long)&flags + 6),
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x112f,(bool *)((long)&flags + 7));
                _has_expired = 0;
                if ((__range2._7_1_ & 1) == 0) {
                  _has_expired = 0x200000;
                }
                if ((flags._7_1_ & 1) != 0) {
                  _has_expired = _has_expired | 0x80000;
                }
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ = (__range2._7_1_ & 1) * 9;
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._0_4_ = 0;
                if ((__range2._7_1_ & 1) != 0) {
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_4_ = 10;
                }
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__4.message_);
                local_2a8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&root.not_yet_valid);
                local_2a0 = &local_2a8;
                local_298 = 1;
                std::allocator<x509_st_*>::allocator(&local_2a9);
                __l_25._M_len = local_298;
                __l_25._M_array = local_2a0;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_290,__l_25,&local_2a9);
                local_2e0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&intermediate.not_yet_valid);
                local_2d8 = &local_2e0;
                local_2d0 = 1;
                std::allocator<x509_st_*>::allocator(&local_2e1);
                __l_24._M_len = local_2d0;
                __l_24._M_array = local_2d8;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_2c8,__l_24,&local_2e1);
                local_308.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_308.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_308.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_308);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_328,(nullptr_t)0x0);
                local_274 = Verify(pxVar3,&local_290,&local_2c8,&local_308,_has_expired,&local_328);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_270,"not_yet_valid",
                           "Verify(leaf.not_yet_valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,(int *)((long)&gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   + 4),&local_274);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_328);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_308);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_2c8);
                std::allocator<x509_st_*>::~allocator(&local_2e1);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_290);
                std::allocator<x509_st_*>::~allocator(&local_2a9);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_270);
                if (!bVar1) {
                  testing::Message::Message(&local_330);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x113e,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_1.message_,&local_330);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_1.message_);
                  testing::Message::~Message(&local_330);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.not_yet_valid)
                ;
                local_380 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&root.not_yet_valid);
                local_378 = &local_380;
                local_370 = 1;
                std::allocator<x509_st_*>::allocator(&local_381);
                __l_23._M_len = local_370;
                __l_23._M_array = local_378;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_368,__l_23,&local_381);
                local_3b8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__3.message_);
                local_3b0 = &local_3b8;
                local_3a8 = 1;
                std::allocator<x509_st_*>::allocator(&local_3b9);
                __l_22._M_len = local_3a8;
                __l_22._M_array = local_3b0;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_3a0,__l_22,&local_3b9);
                local_3d8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_3d8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_3d8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_3d8);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_3f8,(nullptr_t)0x0);
                local_34c = Verify(pxVar3,&local_368,&local_3a0,&local_3d8,_has_expired,&local_3f8);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_348,"not_yet_valid",
                           "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.not_yet_valid.get()}, {}, flags)"
                           ,(int *)((long)&gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   + 4),&local_34c);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_3f8);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_3d8);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_3a0);
                std::allocator<x509_st_*>::~allocator(&local_3b9);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_368);
                std::allocator<x509_st_*>::~allocator(&local_381);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_348);
                if (!bVar1) {
                  testing::Message::Message(&local_400);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1141,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_2.message_,&local_400);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_2.message_);
                  testing::Message::~Message(&local_400);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.not_yet_valid)
                ;
                local_450 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
                local_448 = &local_450;
                local_440 = 1;
                std::allocator<x509_st_*>::allocator(&local_451);
                __l_21._M_len = local_440;
                __l_21._M_array = local_448;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_438,__l_21,&local_451);
                local_488 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&intermediate.not_yet_valid);
                local_480 = &local_488;
                local_478 = 1;
                std::allocator<x509_st_*>::allocator(&local_489);
                __l_20._M_len = local_478;
                __l_20._M_array = local_480;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_470,__l_20,&local_489);
                local_4a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_4a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_4a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_4a8);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_4c8,(nullptr_t)0x0);
                local_41c = Verify(pxVar3,&local_438,&local_470,&local_4a8,_has_expired,&local_4c8);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_418,"not_yet_valid",
                           "Verify(leaf.valid.get(), {root.not_yet_valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,(int *)((long)&gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   + 4),&local_41c);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_4c8);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_4a8);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_470);
                std::allocator<x509_st_*>::~allocator(&local_489);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_438);
                std::allocator<x509_st_*>::~allocator(&local_451);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_418);
                if (!bVar1) {
                  testing::Message::Message(&local_4d0);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1144,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_3.message_,&local_4d0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_3.message_);
                  testing::Message::~Message(&local_4d0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
                local_4f0[1] = 0;
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.not_yet_valid)
                ;
                local_520 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&root.not_yet_valid);
                local_518 = &local_520;
                local_510 = 1;
                std::allocator<x509_st_*>::allocator(&local_521);
                __l_19._M_len = local_510;
                __l_19._M_array = local_518;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_508,__l_19,&local_521);
                local_558 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&intermediate.not_yet_valid);
                local_550 = &local_558;
                local_548 = 1;
                std::allocator<x509_st_*>::allocator(&local_559);
                __l_18._M_len = local_548;
                __l_18._M_array = local_550;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_540,__l_18,&local_559);
                local_578.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_578.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_578.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_578);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_598,(nullptr_t)0x0);
                local_4f0[0] = Verify(pxVar3,&local_508,&local_540,&local_578,_has_expired,
                                      &local_598);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_4e8,"0",
                           "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,local_4f0 + 1,local_4f0);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_598);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_578);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_540);
                std::allocator<x509_st_*>::~allocator(&local_559);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_508);
                std::allocator<x509_st_*>::~allocator(&local_521);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_4e8);
                if (!bVar1) {
                  testing::Message::Message(&local_5a0);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1147,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_4.message_,&local_5a0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_4.message_);
                  testing::Message::~Message(&local_5a0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.valid);
                local_5f0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&root.not_yet_valid);
                local_5e8 = &local_5f0;
                local_5e0 = 1;
                std::allocator<x509_st_*>::allocator(&local_5f1);
                __l_17._M_len = local_5e0;
                __l_17._M_array = local_5e8;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_5d8,__l_17,&local_5f1);
                local_628 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&intermediate.not_yet_valid);
                local_620 = &local_628;
                local_618 = 1;
                std::allocator<x509_st_*>::allocator(&local_629);
                __l_16._M_len = local_618;
                __l_16._M_array = local_620;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_610,__l_16,&local_629);
                local_648.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_648.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_648.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_648);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_668,(nullptr_t)0x0);
                local_5bc = Verify(pxVar3,&local_5d8,&local_610,&local_648,_has_expired,&local_668);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_5b8,"has_expired",
                           "Verify(leaf.expired.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,(int *)&gtest_ar.message_,&local_5bc);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_668);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_648);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_610);
                std::allocator<x509_st_*>::~allocator(&local_629);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_5d8);
                std::allocator<x509_st_*>::~allocator(&local_5f1);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_5b8);
                if (!bVar1) {
                  testing::Message::Message(&local_670);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x114a,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_5.message_,&local_670);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_5.message_);
                  testing::Message::~Message(&local_670);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.not_yet_valid)
                ;
                local_6c0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&root.not_yet_valid);
                local_6b8 = &local_6c0;
                local_6b0 = 1;
                std::allocator<x509_st_*>::allocator(&local_6c1);
                __l_15._M_len = local_6b0;
                __l_15._M_array = local_6b8;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_6a8,__l_15,&local_6c1);
                local_6f8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&intermediate.valid);
                local_6f0 = &local_6f8;
                local_6e8 = 1;
                std::allocator<x509_st_*>::allocator(&local_6f9);
                __l_14._M_len = local_6e8;
                __l_14._M_array = local_6f0;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_6e0,__l_14,&local_6f9);
                local_718.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_718.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_718.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_718);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_738,(nullptr_t)0x0);
                local_68c = Verify(pxVar3,&local_6a8,&local_6e0,&local_718,_has_expired,&local_738);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_688,"has_expired",
                           "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.expired.get()}, {}, flags)"
                           ,(int *)&gtest_ar.message_,&local_68c);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_738);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_718);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_6e0);
                std::allocator<x509_st_*>::~allocator(&local_6f9);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_6a8);
                std::allocator<x509_st_*>::~allocator(&local_6c1);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_688);
                if (!bVar1) {
                  testing::Message::Message(&local_740);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x114c,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_6.message_,&local_740);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_6.message_);
                  testing::Message::~Message(&local_740);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.not_yet_valid)
                ;
                local_790 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.valid);
                local_788 = &local_790;
                local_780 = 1;
                std::allocator<x509_st_*>::allocator(&local_791);
                __l_13._M_len = local_780;
                __l_13._M_array = local_788;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_778,__l_13,&local_791);
                local_7c8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&intermediate.not_yet_valid);
                local_7c0 = &local_7c8;
                local_7b8 = 1;
                std::allocator<x509_st_*>::allocator(&local_7c9);
                __l_12._M_len = local_7b8;
                __l_12._M_array = local_7c0;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_7b0,__l_12,&local_7c9);
                local_7e8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_7e8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_7e8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_7e8);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_808,(nullptr_t)0x0);
                local_75c = Verify(pxVar3,&local_778,&local_7b0,&local_7e8,_has_expired,&local_808);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_758,"has_expired",
                           "Verify(leaf.valid.get(), {root.expired.get()}, {intermediate.valid.get()}, {}, flags)"
                           ,(int *)&gtest_ar.message_,&local_75c);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_808);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_7e8);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_7b0);
                std::allocator<x509_st_*>::~allocator(&local_7c9);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_778);
                std::allocator<x509_st_*>::~allocator(&local_791);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_758);
                if (!bVar1) {
                  testing::Message::Message(&local_810);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_758);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x114e,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_7.message_,&local_810);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_7.message_);
                  testing::Message::~Message(&local_810);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
                if ((flags._7_1_ & 1) == 0) {
                  local_830[1] = 2;
                  pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                     (&leaf.not_yet_valid);
                  local_860 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        (&root_cross.not_yet_valid);
                  local_858 = &local_860;
                  local_850 = 1;
                  std::allocator<x509_st_*>::allocator(&local_861);
                  __l_11._M_len = local_850;
                  __l_11._M_array = local_858;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_848,__l_11,&local_861);
                  local_898 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        (&intermediate.not_yet_valid);
                  local_890 = &local_898;
                  local_888 = 1;
                  std::allocator<x509_st_*>::allocator(&local_899);
                  __l_10._M_len = local_888;
                  __l_10._M_array = local_890;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_880,__l_10,&local_899);
                  local_8b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_8b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_8b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_8b8);
                  std::function<void_(x509_store_ctx_st_*)>::function(&local_8d8,(nullptr_t)0x0);
                  local_830[0] = Verify(pxVar3,&local_848,&local_880,&local_8b8,_has_expired,
                                        &local_8d8);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_828,"2",
                             "Verify(leaf.valid.get(), {root_cross.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                             ,local_830 + 1,local_830);
                  std::function<void_(x509_store_ctx_st_*)>::~function(&local_8d8);
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_8b8);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_880);
                  std::allocator<x509_st_*>::~allocator(&local_899);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_848);
                  std::allocator<x509_st_*>::~allocator(&local_861);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_828);
                  if (!bVar1) {
                    testing::Message::Message(&local_8e0);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_828)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x1154,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_8.message_,&local_8e0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_8.message_);
                    testing::Message::~Message(&local_8e0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_828);
                }
                else {
                  local_900[1] = 0;
                  pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                     (&leaf.not_yet_valid);
                  local_930 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        (&root_cross.not_yet_valid);
                  local_928 = &local_930;
                  local_920 = 1;
                  std::allocator<x509_st_*>::allocator(&local_931);
                  __l_09._M_len = local_920;
                  __l_09._M_array = local_928;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_918,__l_09,&local_931);
                  local_968 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        (&intermediate.not_yet_valid);
                  local_960 = &local_968;
                  local_958 = 1;
                  std::allocator<x509_st_*>::allocator(&local_969);
                  __l_08._M_len = local_958;
                  __l_08._M_array = local_960;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_950,__l_08,&local_969);
                  local_988.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_988.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_988.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_988);
                  std::function<void_(x509_store_ctx_st_*)>::function(&local_9a8,(nullptr_t)0x0);
                  local_900[0] = Verify(pxVar3,&local_918,&local_950,&local_988,_has_expired,
                                        &local_9a8);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_8f8,"0",
                             "Verify(leaf.valid.get(), {root_cross.valid.get()}, {intermediate.valid.get()}, {}, flags)"
                             ,local_900 + 1,local_900);
                  std::function<void_(x509_store_ctx_st_*)>::~function(&local_9a8);
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_988);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_950);
                  std::allocator<x509_st_*>::~allocator(&local_969);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_918);
                  std::allocator<x509_st_*>::~allocator(&local_931);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_8f8);
                  if (!bVar1) {
                    testing::Message::Message(&local_9b0);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8f8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x1158,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_9b0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_9b0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
                  pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                     (&leaf.not_yet_valid);
                  local_a00 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                         &gtest_ar__2.message_);
                  local_9f8 = &local_a00;
                  local_9f0 = 1;
                  std::allocator<x509_st_*>::allocator(&local_a01);
                  __l_07._M_len = local_9f0;
                  __l_07._M_array = local_9f8;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_9e8,__l_07,&local_a01);
                  local_a38 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        (&intermediate.not_yet_valid);
                  local_a30 = &local_a38;
                  local_a28 = 1;
                  std::allocator<x509_st_*>::allocator(&local_a39);
                  __l_06._M_len = local_a28;
                  __l_06._M_array = local_a30;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_a20,__l_06,&local_a39);
                  local_a58.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_a58.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_a58.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_a58);
                  std::function<void_(x509_store_ctx_st_*)>::function(&local_a78,(nullptr_t)0x0);
                  local_9cc = Verify(pxVar3,&local_9e8,&local_a20,&local_a58,_has_expired,&local_a78
                                    );
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_9c8,"not_yet_valid",
                             "Verify(leaf.valid.get(), {root_cross.not_yet_valid.get()}, {intermediate.valid.get()}, {}, flags)"
                             ,(int *)((long)&gtest_ar.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     + 4),&local_9cc);
                  std::function<void_(x509_store_ctx_st_*)>::~function(&local_a78);
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_a58);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_a20);
                  std::allocator<x509_st_*>::~allocator(&local_a39);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_9e8);
                  std::allocator<x509_st_*>::~allocator(&local_a01);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_9c8);
                  if (!bVar1) {
                    testing::Message::Message(&local_a80);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9c8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x115c,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_10.message_,&local_a80);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_10.message_);
                    testing::Message::~Message(&local_a80);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c8);
                  pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                     (&leaf.not_yet_valid);
                  local_ad0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        (&root_cross.valid);
                  local_ac8 = &local_ad0;
                  local_ac0 = 1;
                  std::allocator<x509_st_*>::allocator(&local_ad1);
                  __l_05._M_len = local_ac0;
                  __l_05._M_array = local_ac8;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_ab8,__l_05,&local_ad1);
                  local_b08 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                        (&intermediate.not_yet_valid);
                  local_b00 = &local_b08;
                  local_af8 = 1;
                  std::allocator<x509_st_*>::allocator(&local_b09);
                  __l_04._M_len = local_af8;
                  __l_04._M_array = local_b00;
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                            (&local_af0,__l_04,&local_b09);
                  local_b28.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_b28.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_b28.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_b28);
                  std::function<void_(x509_store_ctx_st_*)>::function(&local_b48,(nullptr_t)0x0);
                  local_a9c = Verify(pxVar3,&local_ab8,&local_af0,&local_b28,_has_expired,&local_b48
                                    );
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_a98,"has_expired",
                             "Verify(leaf.valid.get(), {root_cross.expired.get()}, {intermediate.valid.get()}, {}, flags)"
                             ,(int *)&gtest_ar.message_,&local_a9c);
                  std::function<void_(x509_store_ctx_st_*)>::~function(&local_b48);
                  std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_b28);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_af0);
                  std::allocator<x509_st_*>::~allocator(&local_b09);
                  std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_ab8);
                  std::allocator<x509_st_*>::~allocator(&local_ad1);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_a98);
                  if (!bVar1) {
                    testing::Message::Message(&local_b50);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a98)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0x115f,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_11.message_,&local_b50);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_11.message_);
                    testing::Message::~Message(&local_b50);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
                }
                local_b70[1] = 0;
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.not_yet_valid)
                ;
                local_ba0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      (&root.not_yet_valid);
                local_b98 = &local_ba0;
                local_b90 = 1;
                std::allocator<x509_st_*>::allocator(&local_ba1);
                __l_03._M_len = local_b90;
                __l_03._M_array = local_b98;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_b88,__l_03,&local_ba1);
                local_bc8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_bc8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_bc8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_bc8);
                local_be8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_be8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_be8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_be8);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_c08,(nullptr_t)0x0);
                local_b70[0] = Verify(pxVar3,&local_b88,&local_bc8,&local_be8,_has_expired,
                                      &local_c08);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_b68,"0",
                           "Verify(root.valid.get(), {root.valid.get()}, {}, {}, flags)",
                           local_b70 + 1,local_b70);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_c08);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_be8);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_bc8);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_b88);
                std::allocator<x509_st_*>::~allocator(&local_ba1);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_b68);
                if (!bVar1) {
                  testing::Message::Message(&local_c10);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b68);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1165,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_12.message_,&local_c10);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_12.message_);
                  testing::Message::~Message(&local_c10);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_b68);
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__1.message_);
                local_c60 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__1.message_);
                local_c58 = &local_c60;
                local_c50 = 1;
                std::allocator<x509_st_*>::allocator(&local_c61);
                __l_02._M_len = local_c50;
                __l_02._M_array = local_c58;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_c48,__l_02,&local_c61);
                local_c88.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_c88.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_c88.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_c88);
                local_ca8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_ca8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_ca8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_ca8);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_cc8,(nullptr_t)0x0);
                local_c2c = Verify(pxVar3,&local_c48,&local_c88,&local_ca8,_has_expired,&local_cc8);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_c28,"not_yet_valid",
                           "Verify(root.not_yet_valid.get(), {root.not_yet_valid.get()}, {}, {}, flags)"
                           ,(int *)((long)&gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   + 4),&local_c2c);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_cc8);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_ca8);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_c88);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_c48);
                std::allocator<x509_st_*>::~allocator(&local_c61);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_c28);
                if (!bVar1) {
                  testing::Message::Message(&local_cd0);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c28);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x1168,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_13.message_,&local_cd0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_13.message_);
                  testing::Message::~Message(&local_cd0);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_c28);
                pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.valid);
                local_d20 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.valid);
                local_d18 = &local_d20;
                local_d10 = 1;
                std::allocator<x509_st_*>::allocator(&local_d21);
                __l_01._M_len = local_d10;
                __l_01._M_array = local_d18;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          (&local_d08,__l_01,&local_d21);
                local_d48.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_d48.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_d48.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_d48);
                local_d68.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_d68.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_d68.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_d68);
                std::function<void_(x509_store_ctx_st_*)>::function(&local_d88,(nullptr_t)0x0);
                local_cec = Verify(pxVar3,&local_d08,&local_d48,&local_d68,_has_expired,&local_d88);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_ce8,"has_expired",
                           "Verify(root.expired.get(), {root.expired.get()}, {}, {}, flags)",
                           (int *)&gtest_ar.message_,&local_cec);
                std::function<void_(x509_store_ctx_st_*)>::~function(&local_d88);
                std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_d68);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_d48);
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_d08);
                std::allocator<x509_st_*>::~allocator(&local_d21);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_ce8);
                if (!bVar1) {
                  testing::Message::Message(&local_d90);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ce8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x116a,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_14.message_,&local_d90);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_14.message_);
                  testing::Message::~Message(&local_d90);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce8);
                testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&flags + 6));
              }
              testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&__range2 + 6));
            }
            local_db0[1] = 10;
            pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.not_yet_valid);
            local_de0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.not_yet_valid);
            local_dd8 = &local_de0;
            local_dd0 = 1;
            std::allocator<x509_st_*>::allocator(&local_de1);
            __l_00._M_len = local_dd0;
            __l_00._M_array = local_dd8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_dc8,__l_00,&local_de1)
            ;
            local_e18 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                  (&intermediate.not_yet_valid);
            local_e10 = &local_e18;
            local_e08 = 1;
            std::allocator<x509_st_*>::allocator(&local_e19);
            __l._M_len = local_e08;
            __l._M_array = local_e10;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_e00,__l,&local_e19);
            local_e38.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_e38.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_e38.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_e38);
            std::function<void(x509_store_ctx_st*)>::
            function<(anonymous_namespace)::X509Test_Expiry_Test::TestBody()::__0,void>
                      ((function<void(x509_store_ctx_st*)> *)&local_e58,&local_e59);
            local_db0[0] = Verify(pxVar3,&local_dc8,&local_e00,&local_e38,0,&local_e58);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_da8,"10",
                       "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {}, 0, [](X509_STORE_CTX *ctx) { X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx); X509_VERIFY_PARAM_clear_flags(param, 0x2); })"
                       ,local_db0 + 1,local_db0);
            std::function<void_(x509_store_ctx_st_*)>::~function(&local_e58);
            std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_e38);
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_e00);
            std::allocator<x509_st_*>::~allocator(&local_e19);
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_dc8);
            std::allocator<x509_st_*>::~allocator(&local_de1);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da8);
            if (!bVar1) {
              testing::Message::Message(&local_e68);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_da8);
              testing::internal::AssertHelper::AssertHelper
                        (&local_e70,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x1177,pcVar2);
              testing::internal::AssertHelper::operator=(&local_e70,&local_e68);
              testing::internal::AssertHelper::~AssertHelper(&local_e70);
              testing::Message::~Message(&local_e68);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_da8);
          }
          TestBody::Certs::~Certs((Certs *)&gtest_ar__4.message_);
        }
        TestBody::Certs::~Certs((Certs *)&gtest_ar__3.message_);
      }
      TestBody::Certs::~Certs((Certs *)&gtest_ar__2.message_);
    }
    TestBody::Certs::~Certs((Certs *)&gtest_ar__1.message_);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(X509Test, Expiry) {
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  auto make_cert = [&](const char *issuer, const char *subject, bool is_ca,
                       int not_before_offset,
                       int not_after_offset) -> bssl::UniquePtr<X509> {
    bssl::UniquePtr<X509> cert =
        MakeTestCert(issuer, subject, key.get(), is_ca);
    if (cert == nullptr ||
        !ASN1_TIME_adj(X509_getm_notBefore(cert.get()), kReferenceTime,
                       /*offset_day=*/not_before_offset,
                       /*offset_sec=*/0) ||
        !ASN1_TIME_adj(X509_getm_notAfter(cert.get()), kReferenceTime,
                       /*offset_day=*/not_after_offset,
                       /*offset_sec=*/0) ||
        !X509_sign(cert.get(), key.get(), EVP_sha256())) {
      return nullptr;
    }
    return cert;
  };

  struct Certs {
    bssl::UniquePtr<X509> not_yet_valid, valid, expired;
  };
  auto make_certs = [&](const char *issuer, const char *subject,
                        bool is_ca) -> Certs {
    Certs certs;
    certs.not_yet_valid =
        make_cert(issuer, subject, is_ca, /*not_before_offset=*/1,
                  /*not_after_offset=*/2);
    certs.valid = make_cert(issuer, subject, is_ca, /*not_before_offset=*/-1,
                            /*not_after_offset=*/1);
    certs.expired = make_cert(issuer, subject, is_ca, /*not_before_offset=*/-2,
                              /*not_after_offset=*/-1);
    if (certs.not_yet_valid == nullptr || certs.valid == nullptr ||
        certs.expired == nullptr) {
      return Certs{};
    }
    return certs;
  };

  Certs root = make_certs("Root", "Root", /*is_ca=*/true);
  ASSERT_TRUE(root.valid);
  Certs root_cross = make_certs("Root 2", "Root", /*is_ca=*/true);
  ASSERT_TRUE(root_cross.valid);
  Certs intermediate = make_certs("Root", "Intermediate", /*is_ca=*/true);
  ASSERT_TRUE(intermediate.valid);
  Certs leaf = make_certs("Intermediate", "Leaf", /*is_ca=*/false);
  ASSERT_TRUE(leaf.valid);

  for (bool check_time : {true, false}) {
    SCOPED_TRACE(check_time);
    for (bool partial_chain : {true, false}) {
      SCOPED_TRACE(partial_chain);
      unsigned long flags = 0;
      if (!check_time) {
        flags |= X509_V_FLAG_NO_CHECK_TIME;
      }
      if (partial_chain) {
        flags |= X509_V_FLAG_PARTIAL_CHAIN;
      }

      int not_yet_valid =
          check_time ? X509_V_ERR_CERT_NOT_YET_VALID : X509_V_OK;
      int has_expired = check_time ? X509_V_ERR_CERT_HAS_EXPIRED : X509_V_OK;

      EXPECT_EQ(not_yet_valid,
                Verify(leaf.not_yet_valid.get(), {root.valid.get()},
                       {intermediate.valid.get()}, {}, flags));
      EXPECT_EQ(not_yet_valid,
                Verify(leaf.valid.get(), {root.valid.get()},
                       {intermediate.not_yet_valid.get()}, {}, flags));
      EXPECT_EQ(not_yet_valid,
                Verify(leaf.valid.get(), {root.not_yet_valid.get()},
                       {intermediate.valid.get()}, {}, flags));

      EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root.valid.get()},
                                  {intermediate.valid.get()}, {}, flags));

      EXPECT_EQ(has_expired, Verify(leaf.expired.get(), {root.valid.get()},
                                    {intermediate.valid.get()}, {}, flags));
      EXPECT_EQ(has_expired, Verify(leaf.valid.get(), {root.valid.get()},
                                    {intermediate.expired.get()}, {}, flags));
      EXPECT_EQ(has_expired, Verify(leaf.valid.get(), {root.expired.get()},
                                    {intermediate.valid.get()}, {}, flags));

      if (!partial_chain) {
        // By default, non-self-signed certificates are not valid trust anchors.
        EXPECT_EQ(X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT,
                  Verify(leaf.valid.get(), {root_cross.valid.get()},
                         {intermediate.valid.get()}, {}, flags));
      } else {
        // |X509_V_FLAG_PARTIAL_CHAIN| allows non-self-signed trust anchors.
        EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root_cross.valid.get()},
                                    {intermediate.valid.get()}, {}, flags));
        // Expiry of the trust anchor must still be checked.
        EXPECT_EQ(not_yet_valid,
                  Verify(leaf.valid.get(), {root_cross.not_yet_valid.get()},
                         {intermediate.valid.get()}, {}, flags));
        EXPECT_EQ(has_expired,
                  Verify(leaf.valid.get(), {root_cross.expired.get()},
                         {intermediate.valid.get()}, {}, flags));
      }

      // When the trust anchor is the target certificate, expiry should also be
      // checked.
      EXPECT_EQ(X509_V_OK,
                Verify(root.valid.get(), {root.valid.get()}, {}, {}, flags));
      EXPECT_EQ(not_yet_valid,
                Verify(root.not_yet_valid.get(), {root.not_yet_valid.get()}, {},
                       {}, flags));
      EXPECT_EQ(has_expired, Verify(root.expired.get(), {root.expired.get()},
                                    {}, {}, flags));
    }
  }

  // X509_V_FLAG_USE_CHECK_TIME is an internal flag, but one caller relies on
  // being able to clear it to restore the system time. Using the system time,
  // all certificates in this test should read as expired.
  EXPECT_EQ(X509_V_ERR_CERT_HAS_EXPIRED,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.valid.get()}, {}, 0, [](X509_STORE_CTX *ctx) {
                     X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
                     X509_VERIFY_PARAM_clear_flags(param,
                                                   X509_V_FLAG_USE_CHECK_TIME);
                   }));
}